

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O1

void updateSceneGraph(aiNode *pNode,uint index)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (pNode->mNumMeshes != 0) {
    uVar1 = 0;
    do {
      uVar3 = (ulong)uVar1;
      uVar2 = pNode->mMeshes[uVar3];
      if (index < uVar2) {
        pNode->mMeshes[uVar3] = uVar2 - 1;
      }
      else if (uVar2 == index) {
        uVar2 = pNode->mNumMeshes - 1;
        if (uVar1 < uVar2) {
          do {
            pNode->mMeshes[uVar3] = pNode->mMeshes[uVar3 + 1];
            uVar3 = uVar3 + 1;
            uVar2 = pNode->mNumMeshes - 1;
          } while (uVar3 < uVar2);
        }
        pNode->mNumMeshes = uVar2;
        uVar1 = uVar1 - 1;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar3 = 0;
    do {
      updateSceneGraph(pNode->mChildren[uVar3],index);
      uVar3 = uVar3 + 1;
    } while (uVar3 < pNode->mNumChildren);
  }
  return;
}

Assistant:

static void updateSceneGraph(aiNode* pNode, unsigned const index) {
    for (unsigned i = 0; i < pNode->mNumMeshes; ++i) {
        if (pNode->mMeshes[i] > index) {
            --(pNode->mMeshes[i]);
            continue;
        }
        if (pNode->mMeshes[i] == index) {
            for (unsigned j = i; j < pNode->mNumMeshes -1; ++j) {
                pNode->mMeshes[j] = pNode->mMeshes[j+1];
            }
            --(pNode->mNumMeshes);
            --i;
            continue;
        }
    }
    //recurse to all children
    for (unsigned i = 0; i < pNode->mNumChildren; ++i) {
        updateSceneGraph(pNode->mChildren[i], index);
    }
}